

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O0

int __thiscall
ncnn::Einsum::forward
          (Einsum *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  int *piVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float sum_4;
  int l;
  int k_1;
  int j_2;
  int i_4;
  Mat *top_blob_4;
  float sum_3;
  int k;
  int j_1;
  int i_3;
  Mat *top_blob_3;
  float sum_2;
  int j;
  int i_2;
  Mat *top_blob_2;
  float sum_1;
  int i_1;
  Mat *top_blob_1;
  vector<int,_std::allocator<int>_> indexes;
  int out_dims;
  int dim_sizes_index;
  int dim_size;
  int s;
  int in_dims;
  Mat *bottom_blob_1;
  string *lhs_token;
  size_t b;
  int dim_sizes_count;
  vector<int,_std::allocator<int>_> dim_sizes;
  int i;
  float sum;
  Mat *bottom_blob;
  Mat *top_blob;
  size_t elemsize;
  Mat *m_1;
  Mat *m;
  char *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  allocator_type *in_stack_fffffffffffff938;
  allocator_type *in_stack_fffffffffffff940;
  size_type in_stack_fffffffffffff948;
  Mat *in_stack_fffffffffffff950;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  float in_stack_fffffffffffff964;
  reference in_stack_fffffffffffff968;
  undefined8 *in_stack_fffffffffffff970;
  int iVar8;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  int iVar9;
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  Allocator *local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined4 local_460;
  Allocator *local_458;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined8 local_438;
  float local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  reference local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 local_3f8;
  Allocator *local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined8 local_3d0;
  float local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  reference local_3b8;
  float local_3ac;
  int local_3a8;
  int local_3a4;
  reference local_3a0;
  float local_394;
  int local_390;
  undefined4 local_38c;
  reference local_388;
  vector<int,_std::allocator<int>_> local_378;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  const_reference local_348;
  const_reference local_340;
  ulong local_338;
  int local_330 [5];
  undefined4 local_31c;
  vector<int,_std::allocator<int>_> local_318;
  int local_300;
  float local_2fc;
  reference local_2f0;
  size_t local_2e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2d0;
  int local_2bc;
  undefined8 *local_2b8;
  undefined8 *local_2a8;
  undefined8 *local_298;
  reference local_288;
  reference local_280;
  reference local_278;
  reference local_270;
  reference local_268;
  long local_250;
  reference local_248;
  int local_22c;
  undefined8 *local_228;
  int local_21c;
  undefined8 *local_218;
  int local_20c;
  reference local_208;
  undefined1 local_1fd;
  int local_1fc;
  reference local_1f8;
  undefined8 *local_1f0;
  undefined1 local_1dd;
  int local_1dc;
  reference local_1d8;
  undefined8 *local_1d0;
  int local_1bc;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_170;
  undefined8 *local_150;
  undefined8 *local_130;
  reference local_e8;
  reference local_e0;
  reference local_d8;
  reference local_d0;
  reference local_c8;
  Allocator *local_c0;
  int local_b4;
  size_t local_b0;
  void *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  Allocator *local_88;
  int local_7c;
  size_t local_78;
  void *local_70;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_2d8 = in_RDX;
  local_2d0 = in_RSI;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_2e8 = pvVar3->elemsize;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff940);
  if ((bVar2) &&
     (bVar2 = std::operator==(in_stack_fffffffffffff930,in_stack_fffffffffffff928), bVar2)) {
    local_2f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d8,0);
    Mat::create(in_stack_fffffffffffff950,(int)(in_stack_fffffffffffff948 >> 0x20),
                (size_t)in_stack_fffffffffffff940,(Allocator *)in_stack_fffffffffffff938);
    local_268 = local_2f0;
    bVar2 = true;
    if (local_2f0->data != (void *)0x0) {
      local_e8 = local_2f0;
      bVar2 = local_2f0->cstep * (long)local_2f0->c == 0;
    }
    if (!bVar2) {
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d0,0);
      local_2fc = 0.0;
      for (local_300 = 0; local_300 < pvVar3->h; local_300 = local_300 + 1) {
        local_2fc = *(float *)((long)pvVar3->data +
                              (long)local_300 * 4 +
                              (long)pvVar3->w * (long)local_300 * pvVar3->elemsize) + local_2fc;
      }
      *(float *)local_2f0->data = local_2fc;
      return 0;
    }
    return -100;
  }
  local_31c = 1;
  std::allocator<int>::allocator((allocator<int> *)0x1da3699);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             in_stack_fffffffffffff948,(value_type_conflict *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::allocator<int>::~allocator((allocator<int> *)0x1da36ca);
  local_330[0] = 0;
  for (local_338 = 0; uVar1 = local_338,
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_2d0), uVar1 < sVar4;
      local_338 = local_338 + 1) {
    local_340 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(in_RDI + 0xd0),local_338);
    local_348 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d0,local_338);
    local_34c = local_348->dims;
    for (local_350 = 0; local_350 < local_34c; local_350 = local_350 + 1) {
      local_354 = 1;
      if (local_34c == 1) {
        local_354 = local_348->w;
      }
      if ((local_34c == 2) && (local_350 == 0)) {
        local_354 = local_348->h;
      }
      if ((local_34c == 2) && (local_350 == 1)) {
        local_354 = local_348->w;
      }
      if ((local_34c == 3) && (local_350 == 0)) {
        local_354 = local_348->c;
      }
      if ((local_34c == 3) && (local_350 == 1)) {
        local_354 = local_348->h;
      }
      if ((local_34c == 3) && (local_350 == 2)) {
        local_354 = local_348->w;
      }
      if ((local_34c == 4) && (local_350 == 0)) {
        local_354 = local_348->c;
      }
      if ((local_34c == 4) && (local_350 == 1)) {
        local_354 = local_348->d;
      }
      if ((local_34c == 4) && (local_350 == 2)) {
        local_354 = local_348->h;
      }
      if ((local_34c == 4) && (local_350 == 3)) {
        local_354 = local_348->w;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_340);
      iVar8 = local_354;
      local_358 = *pcVar5 + -0x69;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_318,(long)local_358);
      *pvVar6 = iVar8;
      local_35c = local_358 + 1;
      piVar7 = std::max<int>(local_330,&local_35c);
      local_330[0] = *piVar7;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             in_stack_fffffffffffff948);
  local_360 = std::__cxx11::string::size();
  std::allocator<int>::allocator((allocator<int> *)0x1da3a58);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950,
             in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::allocator<int>::~allocator((allocator<int> *)0x1da3a84);
  if (local_360 == 1) {
    local_388 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d8,0);
    std::vector<int,_std::allocator<int>_>::operator[](&local_318,0);
    Mat::create(in_stack_fffffffffffff950,(int)(in_stack_fffffffffffff948 >> 0x20),
                (size_t)in_stack_fffffffffffff940,(Allocator *)in_stack_fffffffffffff938);
    local_270 = local_388;
    bVar2 = true;
    if (local_388->data != (void *)0x0) {
      local_e0 = local_388;
      bVar2 = local_388->cstep * (long)local_388->c == 0;
    }
    if (bVar2) {
      local_2bc = -100;
      goto LAB_01da512b;
    }
    for (local_390 = 0; iVar8 = local_390, local_390 < local_388->w; local_390 = local_390 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,0);
      *pvVar6 = iVar8;
      local_394 = sum_dim((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                          (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
                          (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff968
                          ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                          in_stack_fffffffffffff958);
      local_248 = local_388;
      local_250 = (long)local_390;
      *(float *)((long)local_388->data + local_250 * 4) = local_394;
    }
  }
  if (local_360 == 2) {
    local_3a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d8,0);
    std::vector<int,_std::allocator<int>_>::operator[](&local_318,1);
    std::vector<int,_std::allocator<int>_>::operator[](&local_318,0);
    Mat::create(in_stack_fffffffffffff950,(int)(in_stack_fffffffffffff948 >> 0x20),
                (int)in_stack_fffffffffffff948,(size_t)in_stack_fffffffffffff940,
                (Allocator *)in_stack_fffffffffffff938);
    local_278 = local_3a0;
    bVar2 = true;
    if (local_3a0->data != (void *)0x0) {
      local_d8 = local_3a0;
      bVar2 = local_3a0->cstep * (long)local_3a0->c == 0;
    }
    if (bVar2) {
      local_2bc = -100;
      goto LAB_01da512b;
    }
    for (local_3a4 = 0; iVar8 = local_3a4, local_3a4 < local_3a0->h; local_3a4 = local_3a4 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,0);
      *pvVar6 = iVar8;
      for (local_3a8 = 0; iVar8 = local_3a8, local_3a8 < local_3a0->w; local_3a8 = local_3a8 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,1);
        *pvVar6 = iVar8;
        local_3ac = sum_dim((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                            (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
                            (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                            in_stack_fffffffffffff968,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff958);
        local_208 = local_3a0;
        local_20c = local_3a4;
        *(float *)((long)local_3a0->data +
                  (long)local_3a8 * 4 + (long)local_3a0->w * (long)local_3a4 * local_3a0->elemsize)
             = local_3ac;
      }
    }
  }
  if (local_360 == 3) {
    local_3b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d8,0);
    std::vector<int,_std::allocator<int>_>::operator[](&local_318,2);
    std::vector<int,_std::allocator<int>_>::operator[](&local_318,1);
    std::vector<int,_std::allocator<int>_>::operator[](&local_318,0);
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                (int)((ulong)in_stack_fffffffffffff958 >> 0x20),(int)in_stack_fffffffffffff958,
                (int)((ulong)in_stack_fffffffffffff950 >> 0x20),in_stack_fffffffffffff948,
                (Allocator *)in_stack_fffffffffffff940);
    local_280 = local_3b8;
    bVar2 = true;
    if (local_3b8->data != (void *)0x0) {
      local_d0 = local_3b8;
      bVar2 = local_3b8->cstep * (long)local_3b8->c == 0;
    }
    if (bVar2) {
      local_2bc = -100;
      goto LAB_01da512b;
    }
    for (local_3bc = 0; iVar8 = local_3bc, local_3bc < local_3b8->c; local_3bc = local_3bc + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,0);
      *pvVar6 = iVar8;
      for (local_3c0 = 0; iVar8 = local_3c0, local_3c0 < local_3b8->h; local_3c0 = local_3c0 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,1);
        *pvVar6 = iVar8;
        for (local_3c4 = 0; iVar8 = local_3c4, local_3c4 < local_3b8->w; local_3c4 = local_3c4 + 1)
        {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,2);
          *pvVar6 = iVar8;
          local_3c8 = sum_dim((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                              (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
                              (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                              in_stack_fffffffffffff968,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                              in_stack_fffffffffffff958);
          local_1d0 = &local_410;
          local_94 = local_3b8->w;
          local_98 = local_3b8->h;
          local_9c = local_3b8->d;
          local_a8 = (void *)((long)local_3b8->data +
                             local_3b8->cstep * (long)local_3bc * local_3b8->elemsize);
          local_b0 = local_3b8->elemsize;
          local_b4 = local_3b8->elempack;
          local_c0 = local_3b8->allocator;
          local_90 = &local_410;
          local_38 = (long)local_94 * (long)local_98 * local_b0;
          local_3c = 0x10;
          local_1d8 = local_3b8;
          local_1dc = local_3bc;
          local_1dd = 1;
          local_218 = &local_410;
          local_21c = local_3c0;
          *(float *)((long)local_a8 +
                    (long)local_3c4 * 4 + (long)local_94 * (long)local_3c0 * local_b0) = local_3c8;
          local_2b8 = &local_410;
          local_410 = 0;
          local_400 = 0;
          local_3f8 = 0;
          local_3e8 = 0;
          local_3e4 = 0;
          local_3e0 = 0;
          local_3dc = 0;
          local_3d8 = 0;
          local_3d0 = 0;
          local_408 = 0;
          local_130 = local_2b8;
          local_3f0 = local_c0;
        }
      }
    }
  }
  if (local_360 == 4) {
    local_418 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2d8,0);
    this_00 = &local_318;
    std::vector<int,_std::allocator<int>_>::operator[](this_00,3);
    std::vector<int,_std::allocator<int>_>::operator[](this_00,2);
    std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
    std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
    Mat::create(in_stack_fffffffffffff950,(int)(in_stack_fffffffffffff948 >> 0x20),
                (int)in_stack_fffffffffffff948,(int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                (int)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                (Allocator *)this_00);
    local_288 = local_418;
    bVar2 = true;
    if (local_418->data != (void *)0x0) {
      local_c8 = local_418;
      bVar2 = local_418->cstep * (long)local_418->c == 0;
    }
    if (bVar2) {
      local_2bc = -100;
      goto LAB_01da512b;
    }
    for (local_41c = 0; iVar8 = local_41c, local_41c < local_418->c; local_41c = local_41c + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,0);
      *pvVar6 = iVar8;
      for (local_420 = 0; iVar8 = local_420, local_420 < local_418->d; local_420 = local_420 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,1);
        *pvVar6 = iVar8;
        for (local_424 = 0; iVar8 = local_424, local_424 < local_418->h; local_424 = local_424 + 1)
        {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,2);
          *pvVar6 = iVar8;
          for (local_428 = 0; iVar8 = (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
              local_428 < local_418->w; local_428 = local_428 + 1) {
            iVar9 = local_428;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_378,3);
            *pvVar6 = iVar9;
            in_stack_fffffffffffff964 =
                 sum_dim((vector<int,_std::allocator<int>_> *)
                         CONCAT44(iVar9,in_stack_fffffffffffff978),iVar8,
                         (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff968,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         in_stack_fffffffffffff958);
            local_1f0 = &local_4c0;
            local_5c = local_418->w;
            local_60 = local_418->h;
            local_64 = local_418->d;
            local_70 = (void *)((long)local_418->data +
                               local_418->cstep * (long)local_41c * local_418->elemsize);
            local_78 = local_418->elemsize;
            local_7c = local_418->elempack;
            local_88 = local_418->allocator;
            in_stack_fffffffffffff970 = &local_4c0;
            local_48 = (long)local_5c * (long)local_60 * local_78;
            local_1b0 = &local_478;
            local_1b8 = &local_4c0;
            local_18 = (void *)((long)local_70 +
                               (long)local_5c * (long)local_60 * (long)local_420 * local_78);
            local_8 = &local_478;
            local_228 = &local_478;
            in_stack_fffffffffffff940 =
                 (allocator_type *)((long)local_18 + (long)local_5c * (long)local_424 * local_78);
            *(float *)(in_stack_fffffffffffff940 + (long)local_428 * 4) = in_stack_fffffffffffff964;
            local_2a8 = &local_478;
            local_298 = &local_4c0;
            local_438 = 0;
            local_440 = 0;
            local_444 = 0;
            local_448 = 0;
            local_44c = 0;
            local_450 = 0;
            local_460 = 0;
            local_468 = 0;
            local_470 = 0;
            local_478 = 0;
            local_4c = 0x10;
            local_1bc = local_420;
            local_1f8 = local_418;
            local_1fc = local_41c;
            local_1fd = 1;
            local_22c = local_424;
            local_4c0 = 0;
            local_4b0 = 0;
            local_4a8 = 0;
            local_498 = 0;
            local_494 = 0;
            local_490 = 0;
            local_48c = 0;
            local_488 = 0;
            local_480 = 0;
            local_4b8 = 0;
            in_stack_fffffffffffff968 = local_418;
            local_42c = in_stack_fffffffffffff964;
            local_170 = local_298;
            local_150 = local_2a8;
            local_58 = in_stack_fffffffffffff970;
            local_30 = local_88;
            local_24 = local_7c;
            local_20 = local_78;
            local_10 = local_60;
            local_c = local_5c;
            local_4a0 = local_88;
            local_458 = local_88;
          }
        }
      }
    }
  }
  local_2bc = 0;
LAB_01da512b:
  local_38c = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff940);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff940);
  return local_2bc;
}

Assistant:

int Einsum::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // assert bottom_blobs.size() == lhs_tokens.size()
    // assert top_blobs.size() == 1

    size_t elemsize = bottom_blobs[0].elemsize;

    if (lhs_tokens.empty() && rhs_token == "ii")
    {
        // assert bottom_blobs.size() == 1
        // assert bottom_blob.dims == 2
        // assert bottom_blob.w == bottom_blob.h

        // trace
        Mat& top_blob = top_blobs[0];
        top_blob.create(1, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const Mat& bottom_blob = bottom_blobs[0];

        float sum = 0.f;

        for (int i = 0; i < bottom_blob.h; i++)
        {
            sum += bottom_blob.row(i)[i];
        }

        top_blob[0] = sum;

        return 0;
    }

    // resolve dimension sizes
    std::vector<int> dim_sizes(16, 1); // map ijklmnopqrstuvwx -> dim_size
    int dim_sizes_count = 0;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        const std::string& lhs_token = lhs_tokens[b];
        const Mat& bottom_blob = bottom_blobs[b];
        const int in_dims = bottom_blob.dims;

        for (int s = 0; s < in_dims; s++)
        {
            int dim_size = 1;
            if (in_dims == 1) dim_size = bottom_blob.w;
            if (in_dims == 2 && s == 0) dim_size = bottom_blob.h;
            if (in_dims == 2 && s == 1) dim_size = bottom_blob.w;
            if (in_dims == 3 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 3 && s == 1) dim_size = bottom_blob.h;
            if (in_dims == 3 && s == 2) dim_size = bottom_blob.w;
            if (in_dims == 4 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 4 && s == 1) dim_size = bottom_blob.d;
            if (in_dims == 4 && s == 2) dim_size = bottom_blob.h;
            if (in_dims == 4 && s == 3) dim_size = bottom_blob.w;

            int dim_sizes_index = lhs_token[s] - 'i';
            dim_sizes[dim_sizes_index] = dim_size;
            dim_sizes_count = std::max(dim_sizes_count, dim_sizes_index + 1);
        }
    }

    dim_sizes.resize(dim_sizes_count);

    const int out_dims = (int)rhs_token.size();

    std::vector<int> indexes(dim_sizes_count);

    if (out_dims == 1)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.w; i++)
        {
            indexes[0] = i;

            float sum = sum_dim(dim_sizes, 1, bottom_blobs, lhs_tokens, indexes);

            top_blob[i] = sum;
        }
    }

    if (out_dims == 2)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.h; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.w; j++)
            {
                indexes[1] = j;

                float sum = sum_dim(dim_sizes, 2, bottom_blobs, lhs_tokens, indexes);

                top_blob.row(i)[j] = sum;
            }
        }
    }

    if (out_dims == 3)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.h; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.w; k++)
                {
                    indexes[2] = k;

                    float sum = sum_dim(dim_sizes, 3, bottom_blobs, lhs_tokens, indexes);

                    top_blob.channel(i).row(j)[k] = sum;
                }
            }
        }
    }

    if (out_dims == 4)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[3], dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.d; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.h; k++)
                {
                    indexes[2] = k;

                    for (int l = 0; l < top_blob.w; l++)
                    {
                        indexes[3] = l;

                        float sum = sum_dim(dim_sizes, 4, bottom_blobs, lhs_tokens, indexes);

                        top_blob.channel(i).depth(j).row(k)[l] = sum;
                    }
                }
            }
        }
    }

    return 0;
}